

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void processServiceResponse
               (ResponseDescription *rd,UA_SecureChannel *channel,UA_MessageType messageType,
               UA_UInt32 requestId,UA_ByteString *message)

{
  void *pvVar1;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  long lVar4;
  long lVar5;
  UA_DataType *type;
  void *dst;
  UA_StatusCode UVar6;
  uint uVar7;
  undefined1 local_78 [8];
  UA_NodeId serviceFaultNodeId;
  UA_NodeId expectedNodeId;
  UA_NodeId responseId;
  size_t offset;
  
  serviceFaultNodeId.identifier._8_2_ = 0;
  serviceFaultNodeId.identifier._12_4_ = 0;
  uVar7 = (uint)rd->responseType->binaryEncodingId;
  local_78._0_2_ = 0;
  stack0xffffffffffffff8c = 0x18d00000000;
  pvVar1 = rd->response;
  rd->processed = true;
  expectedNodeId._0_4_ = uVar7;
  if (messageType == UA_MESSAGETYPE_MSG) {
    if (rd->requestId != requestId) {
      UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                   "Reply answers the wrong requestId. Async services are not yet implemented.");
LAB_00127347:
      UVar6 = 0x80020000;
      goto LAB_0012734d;
    }
    responseId.identifier.string.data = (UA_Byte *)0x0;
    UVar3 = UA_decodeBinary(message,(size_t *)responseId.identifier.guid.data4,
                            (void *)((long)&expectedNodeId.identifier + 8),UA_TYPES + 0x10);
    if (UVar3 == 0) {
      UVar2 = UA_NodeId_equal((UA_NodeId *)((long)&expectedNodeId.identifier + 8),
                              (UA_NodeId *)((long)&serviceFaultNodeId.identifier + 8));
      if (UVar2) {
        dst = rd->response;
        type = rd->responseType;
      }
      else {
        UVar2 = UA_NodeId_equal((UA_NodeId *)((long)&expectedNodeId.identifier + 8),
                                (UA_NodeId *)local_78);
        if (!UVar2) {
          UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                       "Reply answers the wrong request. Expected ns=%i,i=%i.But retrieved ns=%i,i=%i"
                       ,0,(ulong)uVar7,(ulong)expectedNodeId.identifier.string.data & 0xffff,
                       responseId._0_4_);
          deleteMembers_noInit((void *)((long)&expectedNodeId.identifier + 8),UA_TYPES + 0x10);
          expectedNodeId.identifier.string.data = (UA_Byte *)0x0;
          responseId.namespaceIndex = 0;
          responseId._2_2_ = 0;
          responseId.identifierType = UA_NODEIDTYPE_NUMERIC;
          responseId.identifier.string.length = 0;
          goto LAB_00127347;
        }
        dst = rd->response;
        type = UA_TYPES + 0x90;
      }
      UVar3 = UA_decodeBinary(message,(size_t *)responseId.identifier.guid.data4,dst,type);
      goto LAB_00127318;
    }
  }
  else {
    if (messageType != UA_MESSAGETYPE_ERR) {
      UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                   "Server replied with the wrong message type");
      UVar6 = 0x807e0000;
      goto LAB_0012734d;
    }
    lVar5 = 0;
    lVar4 = 0x141ba0;
    do {
      if (*(int *)((long)&statusCodeDescriptions[0].code + lVar5) == (int)message->length) {
        lVar4 = (long)&statusCodeDescriptions[0].code + lVar5;
        break;
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x1578);
    UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                 "Server replied with an error message: %s %.*s",*(undefined8 *)(lVar4 + 8),
                 message->data,message[1].length);
    UVar3 = (UA_StatusCode)message->length;
LAB_00127318:
    if (UVar3 == 0) {
      return;
    }
  }
  UVar6 = 0x80b90000;
  if (UVar3 != 0x80080000) {
    UVar6 = UVar3;
  }
LAB_0012734d:
  UA_LOG_INFO((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,"Error receiving the response");
  *(UA_StatusCode *)((long)pvVar1 + 0xc) = UVar6;
  return;
}

Assistant:

static void
processServiceResponse(struct ResponseDescription *rd, UA_SecureChannel *channel,
                       UA_MessageType messageType, UA_UInt32 requestId,
                       UA_ByteString *message) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    const UA_NodeId expectedNodeId =
        UA_NODEID_NUMERIC(0, rd->responseType->binaryEncodingId);
    const UA_NodeId serviceFaultNodeId =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_SERVICEFAULT].binaryEncodingId);

    UA_ResponseHeader *respHeader = (UA_ResponseHeader*)rd->response;
    rd->processed = true;

    if(messageType == UA_MESSAGETYPE_ERR) {
        UA_TcpErrorMessage *msg = (UA_TcpErrorMessage*)message;
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Server replied with an error message: %s %.*s",
                     UA_StatusCode_name(msg->error), msg->reason.length, msg->reason.data);
        retval = msg->error;
        goto finish;
    } else if(messageType != UA_MESSAGETYPE_MSG) {
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Server replied with the wrong message type");
        retval = UA_STATUSCODE_BADTCPMESSAGETYPEINVALID;
        goto finish;
    }

    /* Check that the request id matches */
    /* Todo: we need to demux async responses since a publish responses may come
       at any time */
    if(requestId != rd->requestId) {
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Reply answers the wrong requestId. "
                     "Async services are not yet implemented.");
        retval = UA_STATUSCODE_BADINTERNALERROR;
        goto finish;
    }

    /* Check that the response type matches */
    size_t offset = 0;
    UA_NodeId responseId;
    retval = UA_NodeId_decodeBinary(message, &offset, &responseId);
    if(retval != UA_STATUSCODE_GOOD)
        goto finish;
    if(!UA_NodeId_equal(&responseId, &expectedNodeId)) {
        if(UA_NodeId_equal(&responseId, &serviceFaultNodeId)) {
            /* Take the statuscode from the servicefault */
            retval = UA_decodeBinary(message, &offset, rd->response,
                                     &UA_TYPES[UA_TYPES_SERVICEFAULT]);
        } else {
            UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                         "Reply answers the wrong request. Expected ns=%i,i=%i."
                         "But retrieved ns=%i,i=%i", expectedNodeId.namespaceIndex,
                         expectedNodeId.identifier.numeric, responseId.namespaceIndex,
                         responseId.identifier.numeric);
            UA_NodeId_deleteMembers(&responseId);
            retval = UA_STATUSCODE_BADINTERNALERROR;
        }
        goto finish;
    }

    /* Decode the response */
    retval = UA_decodeBinary(message, &offset, rd->response, rd->responseType);

 finish:
    if(retval == UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Received a response of type %i", responseId.identifier.numeric);
    } else {
        if(retval == UA_STATUSCODE_BADENCODINGLIMITSEXCEEDED)
            retval = UA_STATUSCODE_BADRESPONSETOOLARGE;
        UA_LOG_INFO(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                    "Error receiving the response");
        respHeader->serviceResult = retval;
    }
}